

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  pointer ppcVar1;
  Result RVar2;
  uint uVar3;
  pointer ppcVar4;
  bool bVar5;
  OptionParser parser;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  OptionParser local_d8;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&local_d8,"wasm-objdump",
             "  Print information about the contents of wasm binaries.\n\nexamples:\n  $ wasm-objdump test.wasm\n"
            );
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:46:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:46:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption(&local_d8,'h',"headers","Print headers",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:49:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:49:7)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'j',"section","SECTION","Select just one section",(Callback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:51:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:51:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'s',"full-contents","Print raw section contents",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:53:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:53:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'d',"disassemble","Disassemble function bodies",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:54:62)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:54:62)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,"debug","Print extra debug information",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:60:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:60:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'x',"details","Show section details",(NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:62:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:62:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'r',"reloc","Show relocations inline with disassembly",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:66:20)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:66:20)>
             ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_d8,'\0',"section-offsets",
             "Print section offsets instead of file offsets in code disassembly",
             (NullCallback *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  local_e8 = (code *)0x656d616e656c6966;
  local_f8._8_8_ = 8;
  local_e0 = (code *)((ulong)local_e0 & 0xffffffffffffff00);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:69:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-objdump.cc:69:7)>
             ::_M_manager;
  local_f8._M_unused._M_object = &local_e8;
  wabt::OptionParser::AddArgument(&local_d8,(string *)&local_f8,OneOrMore,(Callback *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
    operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8 + 1));
  }
  wabt::OptionParser::Parse(&local_d8,argc,argv);
  if (local_d8.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_d8.on_error_,(_Any_data *)&local_d8.on_error_,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_d8.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_d8.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.description_._M_dataplus._M_p != &local_d8.description_.field_2) {
    operator_delete(local_d8.description_._M_dataplus._M_p,
                    local_d8.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.program_name_._M_dataplus._M_p != &local_d8.program_name_.field_2) {
    operator_delete(local_d8.program_name_._M_dataplus._M_p,
                    local_d8.program_name_.field_2._M_allocated_capacity + 1);
  }
  ppcVar1 = s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar4 = s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((s_objdump_options.headers == false) && (s_objdump_options.details == false)) &&
      (s_objdump_options.disassemble == false)) && (s_objdump_options.raw == false)) {
    ProgramMain();
    uVar3 = 1;
  }
  else {
    bVar5 = s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar5) {
      RVar2 = dump_file(*s_infiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      while (RVar2.enum_ != Error) {
        ppcVar4 = ppcVar4 + 1;
        bVar5 = ppcVar4 != ppcVar1;
        if (ppcVar4 == ppcVar1) break;
        RVar2 = dump_file(*ppcVar4);
      }
    }
    uVar3 = (uint)bVar5;
  }
  return uVar3;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);
  if (!s_objdump_options.headers && !s_objdump_options.details &&
      !s_objdump_options.disassemble && !s_objdump_options.raw) {
    fprintf(stderr, "At least one of the following switches must be given:\n");
    fprintf(stderr, " -d/--disassemble\n");
    fprintf(stderr, " -h/--headers\n");
    fprintf(stderr, " -x/--details\n");
    fprintf(stderr, " -s/--full-contents\n");
    return 1;
  }

  for (const char* filename : s_infiles) {
    if (Failed(dump_file(filename))) {
      return 1;
    }
  }

  return 0;
}